

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

void __thiscall ChainstateManager::CheckBlockIndex(ChainstateManager *this)

{
  uint256 *puVar1;
  CChainParams *pCVar2;
  long *plVar3;
  uint64_t uVar4;
  pointer ppCVar5;
  CBlockIndex *pCVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  _Self __tmp;
  Chainstate *pCVar11;
  CBlockIndex *this_00;
  CBlockIndex *pCVar12;
  CBlockIndex *pCVar13;
  Chainstate *pCVar14;
  const_iterator cVar15;
  _Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_> _Var16;
  _Base_ptr p_Var17;
  long lVar18;
  CBlockIndex *pCVar19;
  CBlockIndex *pCVar20;
  uint uVar21;
  _Hash_node_base *p_Var22;
  CBlockIndex *pCVar23;
  CBlockIndex *pCVar24;
  key_type pCVar25;
  CBlockIndex *pCVar26;
  long in_FS_OFFSET;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  pair<std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::_Rb_tree_iterator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  pVar29;
  CBlockIndex *pindex;
  CChain best_hdr_chain;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock41;
  CBlockIndex *pindexPar;
  multimap<CBlockIndex_*,_CBlockIndex_*,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  forward;
  CBlockIndex *local_150;
  CBlockIndex *local_148;
  CBlockIndex *local_140;
  CBlockIndex *local_138;
  CBlockIndex *local_130;
  CBlockIndex *local_118;
  CBlockIndex *local_110;
  CBlockIndex *local_100;
  CBlockIndex *local_f8;
  long local_f0;
  CBlockIndexWorkComparator local_c1;
  key_type local_c0;
  undefined1 local_b8 [16];
  pointer local_a8;
  unique_lock<std::recursive_mutex> local_98;
  vector<Chainstate_*,_std::allocator<Chainstate_*>_> local_88;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  uchar uStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  uchar uStack_69;
  _Rb_tree<CBlockIndex_*,_std::pair<CBlockIndex_*const,_CBlockIndex_*>,_std::_Select1st<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar7 = ShouldCheckBlockIndex(this);
  if (bVar7) {
    local_98._M_device = &cs_main.super_recursive_mutex;
    local_98._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_98);
    pCVar11 = ActiveChainstate(this);
    if ((int)((ulong)((long)(pCVar11->m_chain).vChain.
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pCVar11->m_chain).vChain.
                           super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl
                           .super__Vector_impl_data._M_start) >> 3) < 1) {
      if (1 < (this->m_blockman).m_block_index._M_h._M_element_count) {
        __assert_fail("m_blockman.m_block_index.size() <= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x1468,"void ChainstateManager::CheckBlockIndex()");
      }
    }
    else {
      local_b8 = (undefined1  [16])0x0;
      local_a8 = (pointer)0x0;
      if (this->m_best_header == (CBlockIndex *)0x0) {
        __assert_fail("m_best_header",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x1472,"void ChainstateManager::CheckBlockIndex()");
      }
      CChain::SetTip((CChain *)local_b8,this->m_best_header);
      local_68._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_68._M_impl.super__Rb_tree_header._M_header;
      local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var22 = (this->m_blockman).m_block_index._M_h._M_before_begin._M_nxt;
      local_68._M_impl.super__Rb_tree_header._M_header._M_right =
           local_68._M_impl.super__Rb_tree_header._M_header._M_left;
      if (p_Var22 == (_Hash_node_base *)0x0) {
        lVar18 = 1;
      }
      else {
        do {
          iVar9 = *(int *)&p_Var22[8]._M_nxt;
          if ((long)iVar9 < 0) {
LAB_00af559f:
            if (p_Var22[6]._M_nxt == (_Hash_node_base *)0x0) {
              __assert_fail("block_index.pprev",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                            ,0x147a,"void ChainstateManager::CheckBlockIndex()");
            }
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)(p_Var22 + 5);
            std::
            _Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
            ::_M_emplace_equal<CBlockIndex*&,CBlockIndex*>
                      ((_Rb_tree<CBlockIndex*,std::pair<CBlockIndex*const,CBlockIndex*>,std::_Select1st<std::pair<CBlockIndex*const,CBlockIndex*>>,std::less<CBlockIndex*>,std::allocator<std::pair<CBlockIndex*const,CBlockIndex*>>>
                        *)&local_68,(CBlockIndex **)(p_Var22 + 6),(CBlockIndex **)&local_88);
          }
          else if (((int)((ulong)(local_b8._8_8_ - local_b8._0_8_) >> 3) <= iVar9) ||
                  (*(pointer)(local_b8._0_8_ + (long)iVar9 * 8) != (CBlockIndex *)(p_Var22 + 5)))
          goto LAB_00af559f;
          p_Var22 = p_Var22->_M_nxt;
        } while (p_Var22 != (_Hash_node_base *)0x0);
        lVar18 = local_68._M_impl.super__Rb_tree_header._M_node_count + 1;
      }
      if (((local_b8._8_8_ - local_b8._0_8_) * 0x20000000 + -0x100000000 >> 0x20) + lVar18 !=
          (this->m_blockman).m_block_index._M_h._M_element_count) {
        __assert_fail("forward.size() + best_hdr_chain.Height() + 1 == m_blockman.m_block_index.size()"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x147e,"void ChainstateManager::CheckBlockIndex()");
      }
      if ((int)((ulong)(local_b8._8_8_ - local_b8._0_8_) >> 3) < 1) {
        local_c0 = (CBlockIndex *)0x0;
LAB_00af66da:
        __assert_fail("pindex",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x1481,"void ChainstateManager::CheckBlockIndex()");
      }
      local_c0 = *(key_type *)local_b8._0_8_;
      if (local_c0 == (CBlockIndex *)0x0) goto LAB_00af66da;
      if (this->m_active_chainstate == (Chainstate *)0x0) {
        this_00 = (CBlockIndex *)0x0;
      }
      else {
        this_00 = Chainstate::SnapshotBase(this->m_active_chainstate);
      }
      if (local_c0 == (CBlockIndex *)0x0) {
        local_f0 = 0;
      }
      else {
        local_f0 = 0;
        uVar10 = 0;
        local_110 = (CBlockIndex *)0x0;
        local_100 = (CBlockIndex *)0x0;
        local_f8 = (CBlockIndex *)0x0;
        local_148 = (CBlockIndex *)0x0;
        local_150 = (CBlockIndex *)0x0;
        local_140 = (CBlockIndex *)0x0;
        local_118 = (CBlockIndex *)0x0;
        pCVar20 = (CBlockIndex *)0x0;
        pCVar23 = (CBlockIndex *)0x0;
        pCVar19 = local_c0;
        pCVar24 = (CBlockIndex *)0x0;
        pCVar26 = (CBlockIndex *)0x0;
        do {
          if ((local_110 == (CBlockIndex *)0x0) &&
             (local_110 = (CBlockIndex *)0x0, (pCVar19->nStatus & 0x20) != 0)) {
            local_110 = pCVar19;
          }
          if ((local_140 == (CBlockIndex *)0x0) &&
             (local_140 = (CBlockIndex *)0x0, (pCVar19->nStatus & 8) == 0)) {
            local_140 = pCVar19;
          }
          if ((local_150 == (CBlockIndex *)0x0) &&
             (local_150 = (CBlockIndex *)0x0, pCVar19->nTx == 0)) {
            local_150 = pCVar19;
          }
          if (pCVar19->pprev == (CBlockIndex *)0x0) {
            puVar1 = pCVar19->phashBlock;
            if (puVar1 == (uint256 *)0x0) {
              __assert_fail("phashBlock != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/chain.h"
                            ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
            }
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_start =
                 *(pointer *)(puVar1->super_base_blob<256U>).m_data._M_elems;
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_finish._0_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[8];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_finish._1_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[9];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_finish._2_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[10];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_finish._3_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0xb];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_finish._4_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0xc];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_finish._5_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0xd];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_finish._6_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0xe];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_finish._7_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0xf];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0x10];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._1_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0x11];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._2_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0x12];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._3_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0x13];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0x14];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._5_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0x15];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._6_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0x16];
            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._7_1_ =
                 (puVar1->super_base_blob<256U>).m_data._M_elems[0x17];
            uStack_70 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x18];
            uStack_6f = (puVar1->super_base_blob<256U>).m_data._M_elems[0x19];
            uStack_6e = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1a];
            uStack_6d = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1b];
            uStack_6c = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1c];
            uStack_6b = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1d];
            uStack_6a = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1e];
            uStack_69 = (puVar1->super_base_blob<256U>).m_data._M_elems[0x1f];
            pCVar2 = (this->m_options).chainparams;
            auVar28[0] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x10] ==
                          (uchar)local_88.
                                 super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
            auVar28[1] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x11] ==
                          local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._1_1_);
            auVar28[2] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x12] ==
                          local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._2_1_);
            auVar28[3] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x13] ==
                          local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._3_1_);
            auVar28[4] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x14] ==
                          local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._4_1_);
            auVar28[5] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x15] ==
                          local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._5_1_);
            auVar28[6] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x16] ==
                          local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_);
            auVar28[7] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x17] ==
                          local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_);
            auVar28[8] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x18] == uStack_70);
            auVar28[9] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0x19] == uStack_6f);
            auVar28[10] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                            _M_elems[0x1a] == uStack_6e);
            auVar28[0xb] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                             _M_elems[0x1b] == uStack_6d);
            auVar28[0xc] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                             _M_elems[0x1c] == uStack_6c);
            auVar28[0xd] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                             _M_elems[0x1d] == uStack_6b);
            auVar28[0xe] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                             _M_elems[0x1e] == uStack_6a);
            auVar28[0xf] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                             _M_elems[0x1f] == uStack_69);
            auVar27[0] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[0] == (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
            auVar27[1] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[1] == (puVar1->super_base_blob<256U>).m_data._M_elems[1]);
            auVar27[2] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[2] == (puVar1->super_base_blob<256U>).m_data._M_elems[2]);
            auVar27[3] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[3] == (puVar1->super_base_blob<256U>).m_data._M_elems[3]);
            auVar27[4] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[4] == (puVar1->super_base_blob<256U>).m_data._M_elems[4]);
            auVar27[5] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[5] == (puVar1->super_base_blob<256U>).m_data._M_elems[5]);
            auVar27[6] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[6] == (puVar1->super_base_blob<256U>).m_data._M_elems[6]);
            auVar27[7] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[7] == (puVar1->super_base_blob<256U>).m_data._M_elems[7]);
            auVar27[8] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[8] ==
                          (uchar)local_88.
                                 super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish);
            auVar27[9] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                           _M_elems[9] ==
                          local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish._1_1_);
            auVar27[10] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                            _M_elems[10] ==
                           local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish._2_1_);
            auVar27[0xb] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                             _M_elems[0xb] ==
                            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish._3_1_);
            auVar27[0xc] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                             _M_elems[0xc] ==
                            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_1_);
            auVar27[0xd] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                             _M_elems[0xd] ==
                            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish._5_1_);
            auVar27[0xe] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                             _M_elems[0xe] ==
                            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish._6_1_);
            auVar27[0xf] = -((pCVar2->consensus).hashGenesisBlock.super_base_blob<256U>.m_data.
                             _M_elems[0xf] ==
                            local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish._7_1_);
            auVar27 = auVar27 & auVar28;
            if ((ushort)((ushort)(SUB161(auVar27 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar27 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar27 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar27 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar27 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar27 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar27 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar27 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar27 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar27 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar27 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar27 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar27 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar27 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar27 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar27[0xf] >> 7) << 0xf) != 0xffff) {
              __assert_fail("pindex->GetBlockHash() == GetConsensus().hashGenesisBlock",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                            ,0x14bc,"void ChainstateManager::CheckBlockIndex()");
            }
            GetAll(&local_88,this);
            for (pCVar19 = (CBlockIndex *)
                           local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                pCVar19 !=
                (CBlockIndex *)
                CONCAT17(local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish._7_1_,
                         CONCAT16(local_88.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._6_1_,
                                  CONCAT15(local_88.
                                           super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                           ._M_impl.super__Vector_impl_data._M_finish._5_1_,
                                           CONCAT14(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._4_1_,
                                                  CONCAT13(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._3_1_,
                                                  CONCAT12(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._2_1_,
                                                  CONCAT11(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._1_1_,
                                                  (uchar)local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)))))));
                pCVar19 = (CBlockIndex *)&pCVar19->pprev) {
              plVar3 = *(long **)(pCVar19->phashBlock[2].super_base_blob<256U>.m_data._M_elems +
                                 0x18);
              if (((*(long **)pCVar19->phashBlock[3].super_base_blob<256U>.m_data._M_elems != plVar3
                   ) && (pCVar12 = (CBlockIndex *)*plVar3, pCVar12 != (CBlockIndex *)0x0)) &&
                 (local_c0 != pCVar12)) {
                __assert_fail("pindex == c->m_chain.Genesis()",
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                              ,0x14bf,"void ChainstateManager::CheckBlockIndex()");
              }
            }
            if ((CBlockIndex *)
                local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_start != (CBlockIndex *)0x0) {
              operator_delete(local_88.
                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              CONCAT17(local_88.
                                       super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                                       CONCAT16(local_88.
                                                super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                                _6_1_,CONCAT15(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._5_1_,CONCAT14(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_1_,CONCAT13(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._3_1_,CONCAT12(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._2_1_,CONCAT11(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_1_,(uchar)local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ))))))) -
                              (long)local_88.
                                    super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            bVar7 = true;
            pCVar19 = local_c0;
          }
          else {
            uVar21 = pCVar19->nStatus;
            bVar7 = (uVar21 & 6) != 0;
            pCVar12 = (CBlockIndex *)0x0;
            if ((uVar21 & 7) < 3) {
              pCVar12 = pCVar19;
            }
            if (local_148 == (CBlockIndex *)0x0) {
              local_148 = pCVar12;
            }
            pCVar12 = (CBlockIndex *)0x0;
            if ((uVar21 & 4) == 0) {
              pCVar12 = pCVar19;
            }
            if (local_f8 == (CBlockIndex *)0x0) {
              local_f8 = pCVar12;
            }
            if ((local_100 == (CBlockIndex *)0x0) &&
               (local_100 = (CBlockIndex *)0x0, (uVar21 & 7) < 5)) {
              local_100 = pCVar19;
            }
          }
          if ((pCVar19->m_chain_tx_count == 0) && (0 < pCVar19->nSequenceId)) {
            __assert_fail("pindex->nSequenceId <= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14c3,"void ChainstateManager::CheckBlockIndex()");
          }
          uVar21 = pCVar19->nStatus;
          if ((this->m_blockman).m_have_pruned == false) {
            if ((pCVar19->nTx == 0) != ((uVar21 & 8) == 0)) {
              __assert_fail("!(pindex->nStatus & BLOCK_HAVE_DATA) == (pindex->nTx == 0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                            ,0x14c8,"void ChainstateManager::CheckBlockIndex()");
            }
            if (local_140 != local_150) {
              __assert_fail("pindexFirstMissing == pindexFirstNeverProcessed",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                            ,0x14c9,"void ChainstateManager::CheckBlockIndex()");
            }
          }
          else if (((uVar21 & 8) != 0) && (pCVar19->nTx == 0)) {
            __assert_fail("pindex->nTx > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14cc,"void ChainstateManager::CheckBlockIndex()");
          }
          if ((uVar21 & 0x18) == 0x10) {
            __assert_fail("pindex->nStatus & BLOCK_HAVE_DATA",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14ce,"void ChainstateManager::CheckBlockIndex()");
          }
          if (this_00 != (CBlockIndex *)0x0) {
            pCVar12 = CBlockIndex::GetAncestor(this_00,pCVar19->nHeight);
            uVar21 = local_c0->nStatus;
            pCVar19 = local_c0;
            if ((pCVar12 == local_c0) && ((uVar21 & 6) == 0)) {
              __assert_fail("(pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TREE",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                            ,0x14d1,"void ChainstateManager::CheckBlockIndex()");
            }
          }
          if ((pCVar19->nTx == 0) == 2 < (uVar21 & 7)) {
            __assert_fail("((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TRANSACTIONS) == (pindex->nTx > 0)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14d5,"void ChainstateManager::CheckBlockIndex()");
          }
          if ((pCVar19 != this_00 && local_150 != (CBlockIndex *)0x0) ==
              (pCVar19->m_chain_tx_count != 0)) {
            __assert_fail("(pindexFirstNeverProcessed == nullptr || pindex == snap_base) == pindex->HaveNumChainTxs()"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14d8,"void ChainstateManager::CheckBlockIndex()");
          }
          if ((local_148 != (CBlockIndex *)0x0 && pCVar19 != this_00) ==
              (pCVar19->m_chain_tx_count != 0)) {
            __assert_fail("(pindexFirstNotTransactionsValid == nullptr || pindex == snap_base) == pindex->HaveNumChainTxs()"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14d9,"void ChainstateManager::CheckBlockIndex()");
          }
          if (pCVar19->nHeight != uVar10) {
            __assert_fail("pindex->nHeight == nHeight",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14da,"void ChainstateManager::CheckBlockIndex()");
          }
          if ((pCVar19->pprev != (CBlockIndex *)0x0) &&
             (iVar9 = base_uint<256U>::CompareTo
                                (&(pCVar19->nChainWork).super_base_uint<256U>,
                                 &(pCVar19->pprev->nChainWork).super_base_uint<256U>), iVar9 < 0)) {
            __assert_fail("pindex->pprev == nullptr || pindex->nChainWork >= pindex->pprev->nChainWork"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14db,"void ChainstateManager::CheckBlockIndex()");
          }
          if ((1 < (int)uVar10) &&
             ((local_c0->pskip == (CBlockIndex *)0x0 || ((int)uVar10 <= local_c0->pskip->nHeight))))
          {
            __assert_fail("nHeight < 2 || (pindex->pskip && (pindex->pskip->nHeight < nHeight))",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14dc,"void ChainstateManager::CheckBlockIndex()");
          }
          if (!bVar7) {
            __assert_fail("pindexFirstNotTreeValid == nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14dd,"void ChainstateManager::CheckBlockIndex()");
          }
          uVar21 = local_c0->nStatus & 7;
          if ((3 < uVar21) && (local_f8 != (CBlockIndex *)0x0)) {
            __assert_fail("pindexFirstNotChainValid == nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14df,"void ChainstateManager::CheckBlockIndex()");
          }
          if ((4 < uVar21) && (local_100 != (CBlockIndex *)0x0)) {
            __assert_fail("pindexFirstNotScriptsValid == nullptr",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14e0,"void ChainstateManager::CheckBlockIndex()");
          }
          if ((local_110 == (CBlockIndex *)0x0) && ((local_c0->nStatus & 0x60) != 0)) {
            __assert_fail("(pindex->nStatus & BLOCK_FAILED_MASK) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x14e3,"void ChainstateManager::CheckBlockIndex()");
          }
          if (local_c0->pprev == (CBlockIndex *)0x0) {
            if (local_c0->m_chain_tx_count != (ulong)local_c0->nTx) {
              __assert_fail("pindex->m_chain_tx_count == pindex->nTx",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                            ,0x14e8,"void ChainstateManager::CheckBlockIndex()");
            }
          }
          else {
            uVar4 = local_c0->pprev->m_chain_tx_count;
            if ((uVar4 == 0) || ((ulong)local_c0->nTx == 0)) {
              if ((local_c0 != this_00) == (local_c0->m_chain_tx_count != 0)) {
                __assert_fail("(pindex->m_chain_tx_count != 0) == (pindex == snap_base)",
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                              ,0x14ef,"void ChainstateManager::CheckBlockIndex()");
              }
            }
            else if (local_c0->m_chain_tx_count != uVar4 + local_c0->nTx) {
              __assert_fail("pindex->m_chain_tx_count == pindex->nTx + pindex->pprev->m_chain_tx_count"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                            ,0x14eb,"void ChainstateManager::CheckBlockIndex()");
            }
          }
          GetAll(&local_88,this);
          pCVar19 = (CBlockIndex *)
                    CONCAT17(local_88.
                             super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                             .super__Vector_impl_data._M_finish._7_1_,
                             CONCAT16(local_88.
                                      super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                      ._M_impl.super__Vector_impl_data._M_finish._6_1_,
                                      CONCAT15(local_88.
                                               super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                               ._M_impl.super__Vector_impl_data._M_finish._5_1_,
                                               CONCAT14(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._4_1_,
                                                  CONCAT13(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._3_1_,
                                                  CONCAT12(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._2_1_,
                                                  CONCAT11(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._1_1_,
                                                  (uchar)local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)))))));
          for (pCVar12 = (CBlockIndex *)
                         local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                         _M_impl.super__Vector_impl_data._M_start; pCVar12 != pCVar19;
              pCVar12 = (CBlockIndex *)&pCVar12->pprev) {
            pCVar11 = (Chainstate *)pCVar12->phashBlock;
            ppCVar5 = (pCVar11->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
            if ((ppCVar5 !=
                 (pCVar11->m_chain).vChain.
                 super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                 super__Vector_impl_data._M_start) &&
               (pCVar13 = ppCVar5[-1], pCVar13 != (CBlockIndex *)0x0)) {
              bVar7 = ::node::CBlockIndexWorkComparator::operator()(&local_c1,local_c0,pCVar13);
              pCVar25 = local_c0;
              if ((bVar7) || (local_c0 != this_00 && local_150 != (CBlockIndex *)0x0)) {
                cVar15 = std::
                         _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                         ::find(&(pCVar11->setBlockIndexCandidates)._M_t,&local_c0);
                if ((_Rb_tree_header *)cVar15._M_node !=
                    &(pCVar11->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header) {
                  __assert_fail("c->setBlockIndexCandidates.count(pindex) == 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                                ,0x1528,"void ChainstateManager::CheckBlockIndex()");
                }
              }
              else if (local_110 == (CBlockIndex *)0x0) {
                if (local_140 != (CBlockIndex *)0x0) {
                  ppCVar5 = (pCVar11->m_chain).vChain.
                            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                  if (ppCVar5 ==
                      (pCVar11->m_chain).vChain.
                      super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                      super__Vector_impl_data._M_start) {
                    pCVar13 = (CBlockIndex *)0x0;
                  }
                  else {
                    pCVar13 = ppCVar5[-1];
                  }
                  if ((local_c0 != pCVar13) &&
                     (pCVar13 = Chainstate::SnapshotBase(pCVar11), pCVar25 != pCVar13))
                  goto LAB_00af5b44;
                }
                pCVar14 = ActiveChainstate(this);
                if (((pCVar11 == pCVar14) ||
                    (pCVar13 = CBlockIndex::GetAncestor(this_00,local_c0->nHeight),
                    pCVar13 == local_c0)) &&
                   (cVar15 = std::
                             _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                             ::find(&(pCVar11->setBlockIndexCandidates)._M_t,&local_c0),
                   (_Rb_tree_header *)cVar15._M_node ==
                   &(pCVar11->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header)) {
                  __assert_fail("c->setBlockIndexCandidates.count(pindex)",
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                                ,0x1520,"void ChainstateManager::CheckBlockIndex()");
                }
              }
            }
LAB_00af5b44:
          }
          if ((CBlockIndex *)
              local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
              super__Vector_impl_data._M_start != (CBlockIndex *)0x0) {
            operator_delete(local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            CONCAT17(local_88.
                                     super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                                     CONCAT16(local_88.
                                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                              _6_1_,CONCAT15(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._5_1_,CONCAT14(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_1_,CONCAT13(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._3_1_,CONCAT12(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._2_1_,CONCAT11(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_1_,(uchar)local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ))))))) -
                            (long)local_88.
                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          pVar29 = std::
                   _Rb_tree<CBlockIndex_*,_std::pair<CBlockIndex_*const,_CBlockIndex_*>,_std::_Select1st<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                   ::equal_range(&(this->m_blockman).m_blocks_unlinked._M_t,&local_c0->pprev);
          pCVar25 = local_c0;
          _Var16 = pVar29.first._M_node;
          pCVar19 = local_c0->pprev;
          if (_Var16._M_node == pVar29.second._M_node._M_node) {
            bVar7 = true;
          }
          else {
            do {
              if (*(CBlockIndex **)(_Var16._M_node + 1) != pCVar19) {
                __assert_fail("rangeUnlinked.first->first == pindex->pprev",
                              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                              ,0x152f,"void ChainstateManager::CheckBlockIndex()");
              }
              bVar7 = (CBlockIndex *)_Var16._M_node[1]._M_parent != pCVar25;
            } while ((bVar7) &&
                    (_Var16._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var16._M_node),
                    _Var16._M_node != pVar29.second._M_node._M_node));
          }
          if ((pCVar19 != (CBlockIndex *)0x0) &&
             (((local_150 != (CBlockIndex *)0x0 && local_110 == (CBlockIndex *)0x0) &
               (byte)((pCVar25->nStatus & 8) >> 3) & bVar7) == 1)) {
            __assert_fail("foundInUnlinked",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x1538,"void ChainstateManager::CheckBlockIndex()");
          }
          uVar21 = pCVar25->nStatus & 8;
          if ((char)(uVar21 >> 3) == '\0' && bVar7 == false) {
            __assert_fail("!foundInUnlinked",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x153a,"void ChainstateManager::CheckBlockIndex()");
          }
          if (local_140 == (CBlockIndex *)0x0 && bVar7 == false) {
            __assert_fail("!foundInUnlinked",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                          ,0x153b,"void ChainstateManager::CheckBlockIndex()");
          }
          if ((((pCVar19 != (CBlockIndex *)0x0) && (local_140 != (CBlockIndex *)0x0)) &&
              (uVar21 != 0)) && (local_150 == (CBlockIndex *)0x0)) {
            if ((this->m_blockman).m_have_pruned == false) {
              __assert_fail("m_blockman.m_have_pruned",
                            "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                            ,0x153e,"void ChainstateManager::CheckBlockIndex()");
            }
            GetAll(&local_88,this);
            pCVar19 = (CBlockIndex *)
                      CONCAT17(local_88.
                               super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish._7_1_,
                               CONCAT16(local_88.
                                        super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish._6_1_,
                                        CONCAT15(local_88.
                                                 super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_finish._5_1_,
                                                 CONCAT14(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._4_1_,
                                                  CONCAT13(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._3_1_,
                                                  CONCAT12(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._2_1_,
                                                  CONCAT11(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish._1_1_,
                                                  (uchar)local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish)))))));
            for (pCVar12 = (CBlockIndex *)
                           local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                           _M_impl.super__Vector_impl_data._M_start; pCVar12 != pCVar19;
                pCVar12 = (CBlockIndex *)&pCVar12->pprev) {
              pCVar11 = (Chainstate *)pCVar12->phashBlock;
              pCVar14 = ActiveChainstate(this);
              ppCVar5 = (pCVar11->m_chain).vChain.
                        super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                        super__Vector_impl_data._M_finish;
              if (ppCVar5 ==
                  (pCVar11->m_chain).vChain.
                  super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
                  super__Vector_impl_data._M_start) {
                pCVar13 = (CBlockIndex *)0x0;
              }
              else {
                pCVar13 = ppCVar5[-1];
              }
              bVar8 = ::node::CBlockIndexWorkComparator::operator()(&local_c1,local_c0,pCVar13);
              if (((!bVar8) &&
                  (cVar15 = std::
                            _Rb_tree<CBlockIndex_*,_CBlockIndex_*,_std::_Identity<CBlockIndex_*>,_node::CBlockIndexWorkComparator,_std::allocator<CBlockIndex_*>_>
                            ::find(&(pCVar11->setBlockIndexCandidates)._M_t,&local_c0),
                  local_110 == (CBlockIndex *)0x0)) &&
                 ((_Rb_tree_header *)cVar15._M_node ==
                  &(pCVar11->setBlockIndexCandidates)._M_t._M_impl.super__Rb_tree_header)) {
                bVar8 = bVar7;
                if (pCVar11 != pCVar14) {
                  pCVar13 = CBlockIndex::GetAncestor(this_00,local_c0->nHeight);
                  bVar8 = (bool)(bVar7 & pCVar13 == local_c0);
                }
                if (bVar8 != false) {
                  __assert_fail("foundInUnlinked",
                                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                                ,0x154c,"void ChainstateManager::CheckBlockIndex()");
                }
              }
            }
            pCVar25 = local_c0;
            if ((CBlockIndex *)
                local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_start != (CBlockIndex *)0x0) {
              operator_delete(local_88.
                              super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              CONCAT17(local_88.
                                       super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_,
                                       CONCAT16(local_88.
                                                super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage.
                                                _6_1_,CONCAT15(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._5_1_,CONCAT14(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._4_1_,CONCAT13(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._3_1_,CONCAT12(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._2_1_,CONCAT11(local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ._1_1_,(uchar)local_88.
                                                  super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                                  ))))))) -
                              (long)local_88.
                                    super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
              pCVar25 = local_c0;
            }
          }
          if (pCVar25 == this_00) {
            local_130 = local_140;
            local_140 = local_150;
            local_138 = local_148;
            local_150 = local_f8;
            local_148 = local_100;
            local_100 = pCVar24;
            pCVar12 = pCVar23;
            local_f8 = pCVar20;
            pCVar13 = pCVar26;
          }
          else {
            local_130 = local_118;
            pCVar12 = local_148;
            local_118 = local_140;
            pCVar13 = local_150;
            local_150 = pCVar20;
            local_148 = pCVar24;
            local_140 = pCVar26;
            local_138 = pCVar23;
          }
          pVar29 = std::
                   _Rb_tree<CBlockIndex_*,_std::pair<CBlockIndex_*const,_CBlockIndex_*>,_std::_Select1st<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                   ::equal_range(&local_68,&local_c0);
          local_f0 = local_f0 + 1;
          if (pVar29.first._M_node._M_node == pVar29.second._M_node._M_node) {
            iVar9 = local_c0->nHeight;
            if (((long)iVar9 < 0) || ((int)((ulong)(local_b8._8_8_ - local_b8._0_8_) >> 3) <= iVar9)
               ) {
              pCVar19 = (CBlockIndex *)0x0;
            }
            else {
              pCVar19 = *(pointer)(local_b8._0_8_ + (long)iVar9 * 8);
            }
            if (pCVar19 == local_c0) {
              if (((int)uVar10 < -1) ||
                 (uVar10 = uVar10 + 1,
                 (int)((ulong)(local_b8._8_8_ - local_b8._0_8_) >> 3) <= (int)uVar10)) {
                local_c0 = (CBlockIndex *)0x0;
                break;
              }
              pCVar19 = *(pointer)(local_b8._0_8_ + (ulong)uVar10 * 8);
              local_c0 = pCVar19;
              if (pCVar19 == (CBlockIndex *)0x0) break;
            }
            else {
              do {
                pCVar19 = local_148;
                pCVar20 = local_138;
                pCVar23 = local_130;
                pCVar24 = local_150;
                pCVar26 = local_140;
                if (local_c0 != this_00) {
                  pCVar19 = local_100;
                  pCVar20 = pCVar12;
                  pCVar23 = local_118;
                  pCVar24 = local_f8;
                  pCVar26 = pCVar13;
                  local_f8 = local_150;
                  local_100 = local_148;
                  pCVar13 = local_140;
                  pCVar12 = local_138;
                  local_118 = local_130;
                }
                local_130 = local_118;
                local_138 = pCVar12;
                local_140 = pCVar13;
                local_148 = local_100;
                local_150 = local_f8;
                pCVar13 = pCVar26;
                local_f8 = pCVar24;
                local_118 = pCVar23;
                pCVar12 = pCVar20;
                local_100 = pCVar19;
                if (local_c0 == local_110) {
                  local_110 = (CBlockIndex *)0x0;
                }
                if (local_c0 == local_118) {
                  local_118 = (CBlockIndex *)0x0;
                }
                if (local_c0 == pCVar13) {
                  pCVar13 = (CBlockIndex *)0x0;
                }
                if (local_c0 == pCVar12) {
                  pCVar12 = (CBlockIndex *)0x0;
                }
                if (local_c0 == local_f8) {
                  local_f8 = (CBlockIndex *)0x0;
                }
                if (local_c0 == local_100) {
                  local_100 = (CBlockIndex *)0x0;
                }
                local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)local_c0->pprev;
                pVar29 = std::
                         _Rb_tree<CBlockIndex_*,_std::pair<CBlockIndex_*const,_CBlockIndex_*>,_std::_Select1st<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
                         ::equal_range(&local_68,(key_type *)&local_88);
                pCVar25 = local_c0;
                for (_Var16 = pVar29.first._M_node;
                    (CBlockIndex *)_Var16._M_node[1]._M_parent != pCVar25;
                    _Var16._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var16._M_node)) {
                  if (_Var16._M_node == pVar29.second._M_node._M_node) {
                    __assert_fail("rangePar.first != rangePar.second",
                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                                  ,0x1577,"void ChainstateManager::CheckBlockIndex()");
                  }
                }
                p_Var17 = (_Base_ptr)std::_Rb_tree_increment(_Var16._M_node);
                if (p_Var17 != pVar29.second._M_node._M_node) {
                  pCVar19 = (CBlockIndex *)p_Var17[1]._M_parent;
                  local_c0 = pCVar19;
                  goto LAB_00af5eb2;
                }
                uVar21 = uVar10 - 1;
                if ((int)uVar10 < 1) {
                  pCVar19 = (CBlockIndex *)0x0;
                }
                else if ((int)((ulong)(local_b8._8_8_ - local_b8._0_8_) >> 3) < (int)uVar10) {
                  pCVar19 = (CBlockIndex *)0x0;
                }
                else {
                  pCVar19 = *(pointer)(local_b8._0_8_ + (ulong)uVar21 * 8);
                }
                local_c0 = (key_type)
                           local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                if ((CBlockIndex *)
                    local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>._M_impl
                    .super__Vector_impl_data._M_start == pCVar19) {
                  if ((int)uVar10 < 0) {
                    pCVar19 = (CBlockIndex *)0x0;
                  }
                  else if ((int)uVar10 < (int)((ulong)(local_b8._8_8_ - local_b8._0_8_) >> 3)) {
                    pCVar19 = *(pointer)(local_b8._0_8_ + (ulong)uVar10 * 8);
                  }
                  else {
                    pCVar19 = (CBlockIndex *)0x0;
                  }
                  if (local_b8._8_8_ == local_b8._0_8_) {
                    pCVar20 = (CBlockIndex *)0x0;
                  }
                  else {
                    pCVar20 = *(pointer)(local_b8._8_8_ + -8);
                  }
                  local_c0 = pCVar19;
                  if (((CBlockIndex *)
                       local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                       _M_impl.super__Vector_impl_data._M_start != pCVar20) ==
                      (pCVar19 == (CBlockIndex *)0x0)) {
                    __assert_fail("(pindex == nullptr) == (pindexPar == best_hdr_chain.Tip())",
                                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                                  ,0x1584,"void ChainstateManager::CheckBlockIndex()");
                  }
                  goto LAB_00af5eb2;
                }
                uVar10 = uVar21;
              } while ((CBlockIndex *)
                       local_88.super__Vector_base<Chainstate_*,_std::allocator<Chainstate_*>_>.
                       _M_impl.super__Vector_impl_data._M_start != (CBlockIndex *)0x0);
              pCVar19 = (CBlockIndex *)0x0;
            }
          }
          else {
            pCVar19 = (CBlockIndex *)pVar29.first._M_node._M_node[1]._M_parent;
            uVar10 = uVar10 + 1;
            local_c0 = pCVar19;
          }
LAB_00af5eb2:
          pCVar6 = local_118;
          local_118 = local_130;
          pCVar20 = local_150;
          pCVar23 = local_138;
          pCVar24 = local_148;
          pCVar26 = local_140;
          local_150 = pCVar13;
          local_148 = pCVar12;
          local_140 = pCVar6;
        } while (pCVar19 != (CBlockIndex *)0x0);
      }
      if (local_f0 !=
          local_68._M_impl.super__Rb_tree_header._M_node_count +
          ((local_b8._8_8_ - local_b8._0_8_) * 0x20000000 + -0x100000000 >> 0x20) + 1) {
        __assert_fail("nNodes == forward.size() + best_hdr_chain.Height() + 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/validation.cpp"
                      ,0x1590,"void ChainstateManager::CheckBlockIndex()");
      }
      std::
      _Rb_tree<CBlockIndex_*,_std::pair<CBlockIndex_*const,_CBlockIndex_*>,_std::_Select1st<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>,_std::less<CBlockIndex_*>,_std::allocator<std::pair<CBlockIndex_*const,_CBlockIndex_*>_>_>
      ::~_Rb_tree(&local_68);
      if ((pointer)local_b8._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_b8._0_8_,(long)local_a8 - local_b8._0_8_);
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_98);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ChainstateManager::CheckBlockIndex()
{
    if (!ShouldCheckBlockIndex()) {
        return;
    }

    LOCK(cs_main);

    // During a reindex, we read the genesis block and call CheckBlockIndex before ActivateBestChain,
    // so we have the genesis block in m_blockman.m_block_index but no active chain. (A few of the
    // tests when iterating the block tree require that m_chain has been initialized.)
    if (ActiveChain().Height() < 0) {
        assert(m_blockman.m_block_index.size() <= 1);
        return;
    }

    // Build forward-pointing data structure for the entire block tree.
    // For performance reasons, indexes of the best header chain are stored in a vector (within CChain).
    // All remaining blocks are stored in a multimap.
    // The best header chain can differ from the active chain: E.g. its entries may belong to blocks that
    // are not yet validated.
    CChain best_hdr_chain;
    assert(m_best_header);
    best_hdr_chain.SetTip(*m_best_header);

    std::multimap<CBlockIndex*,CBlockIndex*> forward;
    for (auto& [_, block_index] : m_blockman.m_block_index) {
        // Only save indexes in forward that are not part of the best header chain.
        if (!best_hdr_chain.Contains(&block_index)) {
            // Only genesis, which must be part of the best header chain, can have a nullptr parent.
            assert(block_index.pprev);
            forward.emplace(block_index.pprev, &block_index);
        }
    }
    assert(forward.size() + best_hdr_chain.Height() + 1 == m_blockman.m_block_index.size());

    CBlockIndex* pindex = best_hdr_chain[0];
    assert(pindex);
    // Iterate over the entire block tree, using depth-first search.
    // Along the way, remember whether there are blocks on the path from genesis
    // block being explored which are the first to have certain properties.
    size_t nNodes = 0;
    int nHeight = 0;
    CBlockIndex* pindexFirstInvalid = nullptr; // Oldest ancestor of pindex which is invalid.
    CBlockIndex* pindexFirstMissing = nullptr; // Oldest ancestor of pindex which does not have BLOCK_HAVE_DATA, since assumeutxo snapshot if used.
    CBlockIndex* pindexFirstNeverProcessed = nullptr; // Oldest ancestor of pindex for which nTx == 0, since assumeutxo snapshot if used.
    CBlockIndex* pindexFirstNotTreeValid = nullptr; // Oldest ancestor of pindex which does not have BLOCK_VALID_TREE (regardless of being valid or not).
    CBlockIndex* pindexFirstNotTransactionsValid = nullptr; // Oldest ancestor of pindex which does not have BLOCK_VALID_TRANSACTIONS (regardless of being valid or not), since assumeutxo snapshot if used.
    CBlockIndex* pindexFirstNotChainValid = nullptr; // Oldest ancestor of pindex which does not have BLOCK_VALID_CHAIN (regardless of being valid or not), since assumeutxo snapshot if used.
    CBlockIndex* pindexFirstNotScriptsValid = nullptr; // Oldest ancestor of pindex which does not have BLOCK_VALID_SCRIPTS (regardless of being valid or not), since assumeutxo snapshot if used.

    // After checking an assumeutxo snapshot block, reset pindexFirst pointers
    // to earlier blocks that have not been downloaded or validated yet, so
    // checks for later blocks can assume the earlier blocks were validated and
    // be stricter, testing for more requirements.
    const CBlockIndex* snap_base{GetSnapshotBaseBlock()};
    CBlockIndex *snap_first_missing{}, *snap_first_notx{}, *snap_first_notv{}, *snap_first_nocv{}, *snap_first_nosv{};
    auto snap_update_firsts = [&] {
        if (pindex == snap_base) {
            std::swap(snap_first_missing, pindexFirstMissing);
            std::swap(snap_first_notx, pindexFirstNeverProcessed);
            std::swap(snap_first_notv, pindexFirstNotTransactionsValid);
            std::swap(snap_first_nocv, pindexFirstNotChainValid);
            std::swap(snap_first_nosv, pindexFirstNotScriptsValid);
        }
    };

    while (pindex != nullptr) {
        nNodes++;
        if (pindexFirstInvalid == nullptr && pindex->nStatus & BLOCK_FAILED_VALID) pindexFirstInvalid = pindex;
        if (pindexFirstMissing == nullptr && !(pindex->nStatus & BLOCK_HAVE_DATA)) {
            pindexFirstMissing = pindex;
        }
        if (pindexFirstNeverProcessed == nullptr && pindex->nTx == 0) pindexFirstNeverProcessed = pindex;
        if (pindex->pprev != nullptr && pindexFirstNotTreeValid == nullptr && (pindex->nStatus & BLOCK_VALID_MASK) < BLOCK_VALID_TREE) pindexFirstNotTreeValid = pindex;

        if (pindex->pprev != nullptr) {
            if (pindexFirstNotTransactionsValid == nullptr &&
                    (pindex->nStatus & BLOCK_VALID_MASK) < BLOCK_VALID_TRANSACTIONS) {
                pindexFirstNotTransactionsValid = pindex;
            }

            if (pindexFirstNotChainValid == nullptr &&
                    (pindex->nStatus & BLOCK_VALID_MASK) < BLOCK_VALID_CHAIN) {
                pindexFirstNotChainValid = pindex;
            }

            if (pindexFirstNotScriptsValid == nullptr &&
                    (pindex->nStatus & BLOCK_VALID_MASK) < BLOCK_VALID_SCRIPTS) {
                pindexFirstNotScriptsValid = pindex;
            }
        }

        // Begin: actual consistency checks.
        if (pindex->pprev == nullptr) {
            // Genesis block checks.
            assert(pindex->GetBlockHash() == GetConsensus().hashGenesisBlock); // Genesis block's hash must match.
            for (auto c : GetAll()) {
                if (c->m_chain.Genesis() != nullptr) {
                    assert(pindex == c->m_chain.Genesis()); // The chain's genesis block must be this block.
                }
            }
        }
        if (!pindex->HaveNumChainTxs()) assert(pindex->nSequenceId <= 0); // nSequenceId can't be set positive for blocks that aren't linked (negative is used for preciousblock)
        // VALID_TRANSACTIONS is equivalent to nTx > 0 for all nodes (whether or not pruning has occurred).
        // HAVE_DATA is only equivalent to nTx > 0 (or VALID_TRANSACTIONS) if no pruning has occurred.
        if (!m_blockman.m_have_pruned) {
            // If we've never pruned, then HAVE_DATA should be equivalent to nTx > 0
            assert(!(pindex->nStatus & BLOCK_HAVE_DATA) == (pindex->nTx == 0));
            assert(pindexFirstMissing == pindexFirstNeverProcessed);
        } else {
            // If we have pruned, then we can only say that HAVE_DATA implies nTx > 0
            if (pindex->nStatus & BLOCK_HAVE_DATA) assert(pindex->nTx > 0);
        }
        if (pindex->nStatus & BLOCK_HAVE_UNDO) assert(pindex->nStatus & BLOCK_HAVE_DATA);
        if (snap_base && snap_base->GetAncestor(pindex->nHeight) == pindex) {
            // Assumed-valid blocks should connect to the main chain.
            assert((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TREE);
        }
        // There should only be an nTx value if we have
        // actually seen a block's transactions.
        assert(((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TRANSACTIONS) == (pindex->nTx > 0)); // This is pruning-independent.
        // All parents having had data (at some point) is equivalent to all parents being VALID_TRANSACTIONS, which is equivalent to HaveNumChainTxs().
        // HaveNumChainTxs will also be set in the assumeutxo snapshot block from snapshot metadata.
        assert((pindexFirstNeverProcessed == nullptr || pindex == snap_base) == pindex->HaveNumChainTxs());
        assert((pindexFirstNotTransactionsValid == nullptr || pindex == snap_base) == pindex->HaveNumChainTxs());
        assert(pindex->nHeight == nHeight); // nHeight must be consistent.
        assert(pindex->pprev == nullptr || pindex->nChainWork >= pindex->pprev->nChainWork); // For every block except the genesis block, the chainwork must be larger than the parent's.
        assert(nHeight < 2 || (pindex->pskip && (pindex->pskip->nHeight < nHeight))); // The pskip pointer must point back for all but the first 2 blocks.
        assert(pindexFirstNotTreeValid == nullptr); // All m_blockman.m_block_index entries must at least be TREE valid
        if ((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_TREE) assert(pindexFirstNotTreeValid == nullptr); // TREE valid implies all parents are TREE valid
        if ((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_CHAIN) assert(pindexFirstNotChainValid == nullptr); // CHAIN valid implies all parents are CHAIN valid
        if ((pindex->nStatus & BLOCK_VALID_MASK) >= BLOCK_VALID_SCRIPTS) assert(pindexFirstNotScriptsValid == nullptr); // SCRIPTS valid implies all parents are SCRIPTS valid
        if (pindexFirstInvalid == nullptr) {
            // Checks for not-invalid blocks.
            assert((pindex->nStatus & BLOCK_FAILED_MASK) == 0); // The failed mask cannot be set for blocks without invalid parents.
        }
        // Make sure m_chain_tx_count sum is correctly computed.
        if (!pindex->pprev) {
            // If no previous block, nTx and m_chain_tx_count must be the same.
            assert(pindex->m_chain_tx_count == pindex->nTx);
        } else if (pindex->pprev->m_chain_tx_count > 0 && pindex->nTx > 0) {
            // If previous m_chain_tx_count is set and number of transactions in block is known, sum must be set.
            assert(pindex->m_chain_tx_count == pindex->nTx + pindex->pprev->m_chain_tx_count);
        } else {
            // Otherwise m_chain_tx_count should only be set if this is a snapshot
            // block, and must be set if it is.
            assert((pindex->m_chain_tx_count != 0) == (pindex == snap_base));
        }

        // Chainstate-specific checks on setBlockIndexCandidates
        for (auto c : GetAll()) {
            if (c->m_chain.Tip() == nullptr) continue;
            // Two main factors determine whether pindex is a candidate in
            // setBlockIndexCandidates:
            //
            // - If pindex has less work than the chain tip, it should not be a
            //   candidate, and this will be asserted below. Otherwise it is a
            //   potential candidate.
            //
            // - If pindex or one of its parent blocks back to the genesis block
            //   or an assumeutxo snapshot never downloaded transactions
            //   (pindexFirstNeverProcessed is non-null), it should not be a
            //   candidate, and this will be asserted below. The only exception
            //   is if pindex itself is an assumeutxo snapshot block. Then it is
            //   also a potential candidate.
            if (!CBlockIndexWorkComparator()(pindex, c->m_chain.Tip()) && (pindexFirstNeverProcessed == nullptr || pindex == snap_base)) {
                // If pindex was detected as invalid (pindexFirstInvalid is
                // non-null), it is not required to be in
                // setBlockIndexCandidates.
                if (pindexFirstInvalid == nullptr) {
                    // If pindex and all its parents back to the genesis block
                    // or an assumeutxo snapshot block downloaded transactions,
                    // and the transactions were not pruned (pindexFirstMissing
                    // is null), it is a potential candidate. The check
                    // excludes pruned blocks, because if any blocks were
                    // pruned between pindex and the current chain tip, pindex will
                    // only temporarily be added to setBlockIndexCandidates,
                    // before being moved to m_blocks_unlinked. This check
                    // could be improved to verify that if all blocks between
                    // the chain tip and pindex have data, pindex must be a
                    // candidate.
                    //
                    // If pindex is the chain tip, it also is a potential
                    // candidate.
                    //
                    // If the chainstate was loaded from a snapshot and pindex
                    // is the base of the snapshot, pindex is also a potential
                    // candidate.
                    if (pindexFirstMissing == nullptr || pindex == c->m_chain.Tip() || pindex == c->SnapshotBase()) {
                        // If this chainstate is the active chainstate, pindex
                        // must be in setBlockIndexCandidates. Otherwise, this
                        // chainstate is a background validation chainstate, and
                        // pindex only needs to be added if it is an ancestor of
                        // the snapshot that is being validated.
                        if (c == &ActiveChainstate() || snap_base->GetAncestor(pindex->nHeight) == pindex) {
                            assert(c->setBlockIndexCandidates.count(pindex));
                        }
                    }
                    // If some parent is missing, then it could be that this block was in
                    // setBlockIndexCandidates but had to be removed because of the missing data.
                    // In this case it must be in m_blocks_unlinked -- see test below.
                }
            } else { // If this block sorts worse than the current tip or some ancestor's block has never been seen, it cannot be in setBlockIndexCandidates.
                assert(c->setBlockIndexCandidates.count(pindex) == 0);
            }
        }
        // Check whether this block is in m_blocks_unlinked.
        std::pair<std::multimap<CBlockIndex*,CBlockIndex*>::iterator,std::multimap<CBlockIndex*,CBlockIndex*>::iterator> rangeUnlinked = m_blockman.m_blocks_unlinked.equal_range(pindex->pprev);
        bool foundInUnlinked = false;
        while (rangeUnlinked.first != rangeUnlinked.second) {
            assert(rangeUnlinked.first->first == pindex->pprev);
            if (rangeUnlinked.first->second == pindex) {
                foundInUnlinked = true;
                break;
            }
            rangeUnlinked.first++;
        }
        if (pindex->pprev && (pindex->nStatus & BLOCK_HAVE_DATA) && pindexFirstNeverProcessed != nullptr && pindexFirstInvalid == nullptr) {
            // If this block has block data available, some parent was never received, and has no invalid parents, it must be in m_blocks_unlinked.
            assert(foundInUnlinked);
        }
        if (!(pindex->nStatus & BLOCK_HAVE_DATA)) assert(!foundInUnlinked); // Can't be in m_blocks_unlinked if we don't HAVE_DATA
        if (pindexFirstMissing == nullptr) assert(!foundInUnlinked); // We aren't missing data for any parent -- cannot be in m_blocks_unlinked.
        if (pindex->pprev && (pindex->nStatus & BLOCK_HAVE_DATA) && pindexFirstNeverProcessed == nullptr && pindexFirstMissing != nullptr) {
            // We HAVE_DATA for this block, have received data for all parents at some point, but we're currently missing data for some parent.
            assert(m_blockman.m_have_pruned);
            // This block may have entered m_blocks_unlinked if:
            //  - it has a descendant that at some point had more work than the
            //    tip, and
            //  - we tried switching to that descendant but were missing
            //    data for some intermediate block between m_chain and the
            //    tip.
            // So if this block is itself better than any m_chain.Tip() and it wasn't in
            // setBlockIndexCandidates, then it must be in m_blocks_unlinked.
            for (auto c : GetAll()) {
                const bool is_active = c == &ActiveChainstate();
                if (!CBlockIndexWorkComparator()(pindex, c->m_chain.Tip()) && c->setBlockIndexCandidates.count(pindex) == 0) {
                    if (pindexFirstInvalid == nullptr) {
                        if (is_active || snap_base->GetAncestor(pindex->nHeight) == pindex) {
                            assert(foundInUnlinked);
                        }
                    }
                }
            }
        }
        // assert(pindex->GetBlockHash() == pindex->GetBlockHeader().GetHash()); // Perhaps too slow
        // End: actual consistency checks.


        // Try descending into the first subnode. Always process forks first and the best header chain after.
        snap_update_firsts();
        std::pair<std::multimap<CBlockIndex*,CBlockIndex*>::iterator,std::multimap<CBlockIndex*,CBlockIndex*>::iterator> range = forward.equal_range(pindex);
        if (range.first != range.second) {
            // A subnode not part of the best header chain was found.
            pindex = range.first->second;
            nHeight++;
            continue;
        } else if (best_hdr_chain.Contains(pindex)) {
            // Descend further into best header chain.
            nHeight++;
            pindex = best_hdr_chain[nHeight];
            if (!pindex) break; // we are finished, since the best header chain is always processed last
            continue;
        }
        // This is a leaf node.
        // Move upwards until we reach a node of which we have not yet visited the last child.
        while (pindex) {
            // We are going to either move to a parent or a sibling of pindex.
            snap_update_firsts();
            // If pindex was the first with a certain property, unset the corresponding variable.
            if (pindex == pindexFirstInvalid) pindexFirstInvalid = nullptr;
            if (pindex == pindexFirstMissing) pindexFirstMissing = nullptr;
            if (pindex == pindexFirstNeverProcessed) pindexFirstNeverProcessed = nullptr;
            if (pindex == pindexFirstNotTreeValid) pindexFirstNotTreeValid = nullptr;
            if (pindex == pindexFirstNotTransactionsValid) pindexFirstNotTransactionsValid = nullptr;
            if (pindex == pindexFirstNotChainValid) pindexFirstNotChainValid = nullptr;
            if (pindex == pindexFirstNotScriptsValid) pindexFirstNotScriptsValid = nullptr;
            // Find our parent.
            CBlockIndex* pindexPar = pindex->pprev;
            // Find which child we just visited.
            std::pair<std::multimap<CBlockIndex*,CBlockIndex*>::iterator,std::multimap<CBlockIndex*,CBlockIndex*>::iterator> rangePar = forward.equal_range(pindexPar);
            while (rangePar.first->second != pindex) {
                assert(rangePar.first != rangePar.second); // Our parent must have at least the node we're coming from as child.
                rangePar.first++;
            }
            // Proceed to the next one.
            rangePar.first++;
            if (rangePar.first != rangePar.second) {
                // Move to a sibling not part of the best header chain.
                pindex = rangePar.first->second;
                break;
            } else if (pindexPar == best_hdr_chain[nHeight - 1]) {
                // Move to pindex's sibling on the best-chain, if it has one.
                pindex = best_hdr_chain[nHeight];
                // There will not be a next block if (and only if) parent block is the best header.
                assert((pindex == nullptr) == (pindexPar == best_hdr_chain.Tip()));
                break;
            } else {
                // Move up further.
                pindex = pindexPar;
                nHeight--;
                continue;
            }
        }
    }

    // Check that we actually traversed the entire block index.
    assert(nNodes == forward.size() + best_hdr_chain.Height() + 1);
}